

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

Gia_Man_t * Gia_ManBmcDupCone(Gia_Man_t *p,Vec_Int_t *vIns,Vec_Int_t *vNodes,Vec_Int_t *vOuts)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar3;
  bool bVar4;
  int local_4c;
  Gia_Obj_t *pGStack_48;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vTempNode;
  Vec_Int_t *vTempIn;
  Gia_Man_t *pNew;
  Vec_Int_t *vOuts_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vIns_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vIns);
  p_00 = Vec_IntAlloc(iVar1);
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vIns);
    bVar4 = false;
    if (local_4c < iVar1) {
      iVar1 = Vec_IntEntry(vIns,local_4c);
      pGStack_48 = Gia_ManObj(p,iVar1);
      bVar4 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    Vec_IntPush(p_00,pGStack_48->Value);
    local_4c = local_4c + 1;
  }
  iVar1 = Vec_IntSize(vNodes);
  p_01 = Vec_IntAlloc(iVar1);
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNodes);
    bVar4 = false;
    if (local_4c < iVar1) {
      iVar1 = Vec_IntEntry(vNodes,local_4c);
      pGStack_48 = Gia_ManObj(p,iVar1);
      bVar4 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    Vec_IntPush(p_01,pGStack_48->Value);
    local_4c = local_4c + 1;
  }
  pGVar3 = Gia_ManDupFromVecs(p,vIns,vNodes,vOuts,0);
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vIns);
    bVar4 = false;
    if (local_4c < iVar1) {
      iVar1 = Vec_IntEntry(vIns,local_4c);
      pGStack_48 = Gia_ManObj(p,iVar1);
      bVar4 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    uVar2 = Vec_IntEntry(p_00,local_4c);
    pGStack_48->Value = uVar2;
    local_4c = local_4c + 1;
  }
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNodes);
    bVar4 = false;
    if (local_4c < iVar1) {
      iVar1 = Vec_IntEntry(vNodes,local_4c);
      pGStack_48 = Gia_ManObj(p,iVar1);
      bVar4 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    uVar2 = Vec_IntEntry(p_01,local_4c);
    pGStack_48->Value = uVar2;
    local_4c = local_4c + 1;
  }
  local_4c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vOuts);
    bVar4 = false;
    if (local_4c < iVar1) {
      iVar1 = Vec_IntEntry(vOuts,local_4c);
      pGStack_48 = Gia_ManObj(p,iVar1);
      bVar4 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    pGStack_48->Value = 0;
    local_4c = local_4c + 1;
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManBmcDupCone( Gia_Man_t * p, Vec_Int_t * vIns, Vec_Int_t * vNodes, Vec_Int_t * vOuts )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vTempIn, * vTempNode;
    Gia_Obj_t * pObj;
    int i;
    // save values
    vTempIn = Vec_IntAlloc( Vec_IntSize(vIns) );
    Gia_ManForEachObjVec( vIns, p, pObj, i )
        Vec_IntPush( vTempIn, pObj->Value );
    // save values
    vTempNode = Vec_IntAlloc( Vec_IntSize(vNodes) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Vec_IntPush( vTempNode, pObj->Value );
    // derive new GIA
    pNew = Gia_ManDupFromVecs( p, vIns, vNodes, vOuts, 0 );
    // reset values
    Gia_ManForEachObjVec( vIns, p, pObj, i )
        pObj->Value = Vec_IntEntry( vTempIn, i );
    // reset values
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Vec_IntEntry( vTempNode, i );
    // reset values
    Gia_ManForEachObjVec( vOuts, p, pObj, i )
        pObj->Value = 0;
    Vec_IntFree( vTempIn );
    Vec_IntFree( vTempNode );
    return pNew;
}